

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_container_benchmark.c
# Opt level: O2

int main(void)

{
  ushort uVar1;
  ushort uVar2;
  uint *puVar3;
  uint uVar4;
  int iVar5;
  run_container_t *prVar6;
  ulong uVar7;
  rle16_t *prVar8;
  void *__ptr;
  void *__ptr_00;
  ulong uVar9;
  run_container_t *run;
  run_container_t *BO;
  byte bVar10;
  uint uVar11;
  uint16_t uVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  int x_2;
  char *pcVar17;
  short sVar18;
  int y;
  int iVar19;
  int iVar20;
  int x;
  uint uVar21;
  bool bVar22;
  bool bVar23;
  float fVar24;
  timespec ts;
  
  puVar3 = (uint *)cpuid_Version_info(1);
  uVar13 = (ulong)puVar3[2];
  uVar4 = *puVar3 >> 4;
  uVar21 = uVar4 - 0x2065;
  if (uVar21 < 0xb) {
    uVar13 = 0x481;
    if ((0x481U >> (uVar21 & 0x1f) & 1) != 0) {
      pcVar17 = "Westmere";
      goto LAB_001014ce;
    }
    uVar13 = 0x120;
    if ((0x120U >> (uVar21 & 0x1f) & 1) != 0) {
      pcVar17 = "SandyBridge";
      goto LAB_001014ce;
    }
    if (uVar21 != 9) goto LAB_001011f3;
switchD_001013ae_caseD_106a:
    pcVar17 = "Nehalem";
LAB_001014ce:
    iVar19 = 0;
    printf("x64 processor:  %s\t",pcVar17,uVar13);
    printf(" compiler version: %s\t",
           "Clang 19.1.5 (https://github.com/swiftlang/llvm-project.git 188208b14562121ae1ac90190d00d823bcfbccff)"
          );
    putchar(10);
    lVar16 = cpuid(0x80000006);
    if ((char)*(undefined4 *)(lVar16 + 0xc) != '@') {
      lVar16 = cpuid(0x80000006);
      printf("cache line: %d bytes\n",(ulong)(byte)*(uint *)(lVar16 + 0xc),
             (ulong)*(uint *)(lVar16 + 8),(ulong)*(uint *)(lVar16 + 0xc));
    }
    puts("run container benchmarks");
    prVar6 = run_container_create();
    printf("%s: ","add_test(B)");
    fflush((FILE *)0x0);
    uVar13 = 0xffffffffffffffff;
    for (; iVar19 != 500; iVar19 = iVar19 + 1) {
      clock_gettime(3,(timespec *)&ts);
      lVar16 = CONCAT44(ts.tv_sec._4_4_,(int)ts.tv_sec);
      lVar15 = CONCAT44(ts.tv_nsec._4_4_,(int)ts.tv_nsec);
      for (uVar21 = 0; uVar21 < 0x10000; uVar21 = uVar21 + 3) {
        run_container_add(prVar6,(uint16_t)uVar21);
      }
      clock_gettime(3,(timespec *)&ts);
      uVar7 = (CONCAT44(ts.tv_sec._4_4_,(int)ts.tv_sec) - lVar16) * 1000000000 +
              (CONCAT44(ts.tv_nsec._4_4_,(int)ts.tv_nsec) - lVar15);
      if (uVar7 < uVar13) {
        uVar13 = uVar7;
      }
    }
    printf(" %.2f cycles per operation",(double)((float)uVar13 * 0.00048828125));
    putchar(10);
    bVar23 = false;
    fflush((FILE *)0x0);
    iVar19 = contains_test(prVar6);
    printf("%s: ","contains_test(B)");
    fflush((FILE *)0x0);
    iVar20 = 500;
    uVar13 = 0xffffffffffffffff;
    while (bVar22 = iVar20 != 0, iVar20 = iVar20 + -1, bVar22) {
      clock_gettime(3,(timespec *)&ts);
      lVar16 = CONCAT44(ts.tv_sec._4_4_,(int)ts.tv_sec);
      lVar15 = CONCAT44(ts.tv_nsec._4_4_,(int)ts.tv_nsec);
      iVar5 = contains_test(prVar6);
      if (iVar5 != iVar19) {
        bVar23 = true;
      }
      clock_gettime(3,(timespec *)&ts);
      uVar7 = (CONCAT44(ts.tv_sec._4_4_,(int)ts.tv_sec) - lVar16) * 1000000000 +
              (CONCAT44(ts.tv_nsec._4_4_,(int)ts.tv_nsec) - lVar15);
      if (uVar7 < uVar13) {
        uVar13 = uVar7;
      }
    }
    printf(" %.2f cycles per operation",(double)((float)uVar13 * 1.5258789e-05));
    if (bVar23) {
      printf(" [ERROR]");
    }
    putchar(10);
    fflush((FILE *)0x0);
    printf("%s: ","remove_test(B)");
    fflush((FILE *)0x0);
    uVar13 = 0xffffffffffffffff;
    for (iVar19 = 0; iVar19 != 500; iVar19 = iVar19 + 1) {
      clock_gettime(3,(timespec *)&ts);
      lVar16 = CONCAT44(ts.tv_sec._4_4_,(int)ts.tv_sec);
      lVar15 = CONCAT44(ts.tv_nsec._4_4_,(int)ts.tv_nsec);
      sVar18 = -1;
      for (uVar21 = 0; uVar21 < 0x10000; uVar21 = uVar21 + 3) {
        uVar12 = (uint16_t)uVar21;
        uVar4 = interleavedBinarySearch(prVar6->runs,prVar6->n_runs,uVar12);
        if ((int)uVar4 < 0) {
          if (uVar4 != 0xffffffff) {
            uVar11 = -uVar4 - 2;
            prVar8 = prVar6->runs;
            uVar1 = prVar8[uVar11].value;
            uVar2 = prVar8[uVar11].length;
            if ((int)(uVar21 - uVar1) < (int)(uint)uVar2) {
              prVar8[uVar11].length = ~uVar1 + uVar12;
              iVar20 = prVar6->n_runs;
              if (prVar6->capacity <= iVar20) {
                run_container_grow(prVar6,iVar20 + 1,true);
                iVar20 = prVar6->n_runs;
                prVar8 = prVar6->runs;
              }
              uVar4 = ~uVar4;
              uVar11 = uVar4 & 0xffff;
              memmove(prVar8 + (ulong)uVar11 + 1,prVar8 + uVar11,(long)(int)(iVar20 - uVar11) << 2);
              prVar6->n_runs = prVar6->n_runs + 1;
              prVar8 = prVar6->runs;
              prVar8[uVar4].value = uVar12 + 1;
              prVar8[uVar4].length = uVar1 + uVar2 + sVar18;
            }
            else if (uVar21 - uVar1 == (uint)uVar2) {
              prVar8[uVar11].length = uVar2 - 1;
            }
          }
        }
        else {
          prVar8 = prVar6->runs;
          uVar12 = prVar8[uVar4].length;
          if (uVar12 == 0) {
            uVar4 = uVar4 & 0xffff;
            memmove(prVar8 + uVar4,prVar8 + (ulong)uVar4 + 1,
                    (long)(int)(~uVar4 + prVar6->n_runs) << 2);
            prVar6->n_runs = prVar6->n_runs + -1;
          }
          else {
            prVar8[uVar4].value = prVar8[uVar4].value + 1;
            prVar8[uVar4].length = uVar12 - 1;
          }
        }
        sVar18 = sVar18 + -3;
      }
      clock_gettime(3,(timespec *)&ts);
      uVar7 = (CONCAT44(ts.tv_sec._4_4_,(int)ts.tv_sec) - lVar16) * 1000000000 +
              (CONCAT44(ts.tv_nsec._4_4_,(int)ts.tv_nsec) - lVar15);
      if (uVar7 < uVar13) {
        uVar13 = uVar7;
      }
    }
    printf(" %.2f cycles per operation",(double)((float)uVar13 / 21845.0));
    putchar(10);
    fflush((FILE *)0x0);
    run_container_free(prVar6);
    for (uVar21 = 0x20; uVar21 < 0x10001; uVar21 = uVar21 << 3) {
      prVar6 = run_container_create();
      uVar4 = uVar21;
      while (bVar23 = uVar4 != 0, uVar4 = uVar4 - 1, bVar23) {
        uVar11 = (uint)(pcg32_global_0 >> 0x2d) ^ (uint)(pcg32_global_0 >> 0x1b);
        bVar10 = (byte)(pcg32_global_0 >> 0x3b);
        pcg32_global_0 = pcg32_global_0 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
        run_container_add(prVar6,(ushort)(uVar11 >> bVar10) | (ushort)(uVar11 << 0x20 - bVar10));
      }
      __ptr = malloc(0x800);
      uVar4 = run_container_cardinality(prVar6);
      bVar23 = false;
      printf("\n number of values in container = %d\n",(ulong)uVar4);
      uVar4 = run_container_cardinality(prVar6);
      uVar7 = (ulong)(int)uVar4;
      __ptr_00 = malloc(uVar7 * 4);
      printf("%s: ","run_container_to_uint32_array(out, Bt, 1234)");
      fflush((FILE *)0x0);
      iVar19 = 500;
      uVar13 = 0xffffffffffffffff;
      while (bVar22 = iVar19 != 0, iVar19 = iVar19 + -1, bVar22) {
        clock_gettime(3,(timespec *)&ts);
        lVar16 = CONCAT44(ts.tv_sec._4_4_,(int)ts.tv_sec);
        lVar15 = CONCAT44(ts.tv_nsec._4_4_,(int)ts.tv_nsec);
        uVar11 = run_container_to_uint32_array(__ptr_00,prVar6,0x4d2);
        if (uVar11 != uVar4) {
          bVar23 = true;
        }
        clock_gettime(3,(timespec *)&ts);
        uVar9 = (CONCAT44(ts.tv_sec._4_4_,(int)ts.tv_sec) - lVar16) * 1000000000 +
                (CONCAT44(ts.tv_nsec._4_4_,(int)ts.tv_nsec) - lVar15);
        if (uVar9 < uVar13) {
          uVar13 = uVar9;
        }
      }
      if ((long)uVar7 < 0) {
        fVar24 = (float)((ulong)(uVar4 & 1) | uVar7 >> 1);
        fVar24 = fVar24 + fVar24;
      }
      else {
        fVar24 = (float)(int)uVar4;
      }
      printf(" %.2f cycles per operation",(double)((float)uVar13 / fVar24));
      if (bVar23) {
        printf(" [ERROR]");
      }
      putchar(10);
      fflush((FILE *)0x0);
      free(__ptr_00);
      printf("%s %s: ","run_container_contains","run_cache_prefetch");
      fflush((FILE *)0x0);
      iVar19 = 0;
      for (lVar16 = 0; lVar16 != 0x400; lVar16 = lVar16 + 1) {
        lVar15 = cpuid(0x80000006);
        for (lVar14 = 0;
            SBORROW8(lVar14,(long)prVar6->n_runs * 2) != lVar14 + (long)prVar6->n_runs * -2 < 0;
            lVar14 = lVar14 + (ulong)(*(uint *)(lVar15 + 0xc) >> 1 & 0x7f)) {
        }
        clock_gettime(3,(timespec *)&ts);
        iVar5 = (int)ts.tv_nsec;
        iVar20 = (int)ts.tv_sec;
        run_container_contains(prVar6,*(uint16_t *)((long)__ptr + lVar16 * 2));
        clock_gettime(3,(timespec *)&ts);
        iVar19 = iVar19 + ((int)ts.tv_nsec - iVar5) + ((int)ts.tv_sec - iVar20) * 1000000000;
      }
      printf(" %.2f cycles per operation",(double)((float)iVar19 * 0.0009765625));
      putchar(10);
      fflush((FILE *)0x0);
      printf("%s %s: ","run_container_contains","run_cache_flush");
      fflush((FILE *)0x0);
      iVar19 = 0;
      for (lVar16 = 0; lVar16 != 0x400; lVar16 = lVar16 + 1) {
        lVar15 = cpuid(0x80000006);
        uVar4 = *(uint *)(lVar15 + 0xc) >> 1 & 0x7f;
        lVar15 = 0;
        for (lVar14 = 0;
            SBORROW8(lVar14,(long)prVar6->n_runs * 2) != lVar14 + (long)prVar6->n_runs * -2 < 0;
            lVar14 = lVar14 + (ulong)uVar4) {
          clflush(*(undefined1 *)((long)&prVar6->runs->value + lVar15));
          lVar15 = lVar15 + (ulong)(uVar4 << 2);
        }
        clock_gettime(3,(timespec *)&ts);
        iVar5 = (int)ts.tv_nsec;
        iVar20 = (int)ts.tv_sec;
        run_container_contains(prVar6,*(uint16_t *)((long)__ptr + lVar16 * 2));
        clock_gettime(3,(timespec *)&ts);
        iVar19 = iVar19 + ((int)ts.tv_nsec - iVar5) + ((int)ts.tv_sec - iVar20) * 1000000000;
      }
      printf(" %.2f cycles per operation",(double)((float)iVar19 * 0.0009765625));
      putchar(10);
      fflush((FILE *)0x0);
      free(__ptr);
      run_container_free(prVar6);
    }
    putchar(10);
    prVar6 = run_container_create();
    for (uVar21 = 0; uVar21 < 0x10000; uVar21 = uVar21 + 3) {
      run_container_add(prVar6,(uint16_t)uVar21);
    }
    run = run_container_create();
    for (uVar21 = 0; uVar21 < 0x10000; uVar21 = uVar21 + 5) {
      run_container_add(run,(uint16_t)uVar21);
    }
    BO = run_container_create();
    puts("\nUnion and intersections...");
    puts("\nNote:");
    puts("union times are expressed in cycles per number of input elements (both runs)");
    puts("intersection times are expressed in cycles per number of output elements\n");
    puts("==intersection and union test 1 ");
    uVar21 = run_container_cardinality(prVar6);
    uVar4 = run_container_cardinality(run);
    bVar23 = false;
    printf("input 1 cardinality = %d, input 2 cardinality = %d \n",(ulong)uVar21,(ulong)uVar4);
    uVar21 = union_test(prVar6,run,BO);
    printf("union cardinality = %d \n",(ulong)uVar21);
    uVar4 = run_container_cardinality(prVar6);
    uVar11 = run_container_cardinality(run);
    printf("B1 card = %d B2 card = %d \n",(ulong)uVar4,(ulong)uVar11);
    iVar19 = prVar6->n_runs;
    iVar20 = run->n_runs;
    printf("%s: ","union_test(B1, B2, BO)");
    fflush((FILE *)0x0);
    iVar5 = 500;
    uVar13 = 0xffffffffffffffff;
    while (bVar22 = iVar5 != 0, iVar5 = iVar5 + -1, bVar22) {
      clock_gettime(3,(timespec *)&ts);
      lVar16 = CONCAT44(ts.tv_sec._4_4_,(int)ts.tv_sec);
      lVar15 = CONCAT44(ts.tv_nsec._4_4_,(int)ts.tv_nsec);
      uVar4 = union_test(prVar6,run,BO);
      if (uVar4 != uVar21) {
        bVar23 = true;
      }
      clock_gettime(3,(timespec *)&ts);
      uVar7 = (CONCAT44(ts.tv_sec._4_4_,(int)ts.tv_sec) - lVar16) * 1000000000 +
              (CONCAT44(ts.tv_nsec._4_4_,(int)ts.tv_nsec) - lVar15);
      if (uVar7 < uVar13) {
        uVar13 = uVar7;
      }
    }
    printf(" %.2f cycles per operation",
           (double)((float)uVar13 / (float)(ulong)((long)iVar20 + (long)iVar19)));
    if (bVar23) {
      printf(" [ERROR]");
    }
    putchar(10);
    bVar23 = false;
    fflush((FILE *)0x0);
    uVar21 = intersection_test(prVar6,run,BO);
    printf("intersection cardinality = %d \n",(ulong)uVar21);
    printf("%s: ","intersection_test(B1, B2, BO)");
    fflush((FILE *)0x0);
    iVar19 = 500;
    uVar13 = 0xffffffffffffffff;
    while (bVar22 = iVar19 != 0, iVar19 = iVar19 + -1, bVar22) {
      clock_gettime(3,(timespec *)&ts);
      lVar16 = CONCAT44(ts.tv_sec._4_4_,(int)ts.tv_sec);
      lVar15 = CONCAT44(ts.tv_nsec._4_4_,(int)ts.tv_nsec);
      uVar4 = intersection_test(prVar6,run,BO);
      if (uVar4 != uVar21) {
        bVar23 = true;
      }
      clock_gettime(3,(timespec *)&ts);
      uVar7 = (CONCAT44(ts.tv_sec._4_4_,(int)ts.tv_sec) - lVar16) * 1000000000 +
              (CONCAT44(ts.tv_nsec._4_4_,(int)ts.tv_nsec) - lVar15);
      if (uVar7 < uVar13) {
        uVar13 = uVar7;
      }
    }
    if ((long)(int)uVar21 < 0) {
      fVar24 = (float)((ulong)(uVar21 & 1) | (ulong)(long)(int)uVar21 >> 1);
      fVar24 = fVar24 + fVar24;
    }
    else {
      fVar24 = (float)(int)uVar21;
    }
    printf(" %.2f cycles per operation",(double)((float)uVar13 / fVar24));
    if (bVar23) {
      printf(" [ERROR]");
    }
    putchar(10);
    fflush((FILE *)0x0);
    puts("==intersection and union test 2 ");
    prVar6->n_runs = 0;
    run->n_runs = 0;
    for (uVar21 = 0; uVar21 < 0x10000; uVar21 = uVar21 + 0x40) {
      for (uVar4 = 0; (uVar21 & 0xffff) % 0xb != uVar4; uVar4 = uVar4 + 1) {
        run_container_add(prVar6,(short)uVar21 + (short)uVar4);
      }
    }
    for (iVar19 = 1; iVar19 < 0x10000; iVar19 = iVar19 * 2) {
      run_container_add(run,(uint16_t)iVar19);
    }
    uVar21 = run_container_cardinality(prVar6);
    uVar4 = run_container_cardinality(run);
    bVar23 = false;
    printf("input 1 cardinality = %d, input 2 cardinality = %d \n",(ulong)uVar21,(ulong)uVar4);
    uVar21 = union_test(prVar6,run,BO);
    printf("union cardinality = %d \n",(ulong)uVar21);
    uVar4 = run_container_cardinality(prVar6);
    uVar11 = run_container_cardinality(run);
    printf("B1 card = %d B2 card = %d \n",(ulong)uVar4,(ulong)uVar11);
    iVar19 = prVar6->n_runs;
    iVar20 = run->n_runs;
    printf("%s: ","union_test(B1, B2, BO)");
    fflush((FILE *)0x0);
    iVar5 = 500;
    uVar13 = 0xffffffffffffffff;
    while (bVar22 = iVar5 != 0, iVar5 = iVar5 + -1, bVar22) {
      clock_gettime(3,(timespec *)&ts);
      lVar16 = CONCAT44(ts.tv_sec._4_4_,(int)ts.tv_sec);
      lVar15 = CONCAT44(ts.tv_nsec._4_4_,(int)ts.tv_nsec);
      uVar4 = union_test(prVar6,run,BO);
      if (uVar4 != uVar21) {
        bVar23 = true;
      }
      clock_gettime(3,(timespec *)&ts);
      uVar7 = (CONCAT44(ts.tv_sec._4_4_,(int)ts.tv_sec) - lVar16) * 1000000000 +
              (CONCAT44(ts.tv_nsec._4_4_,(int)ts.tv_nsec) - lVar15);
      if (uVar7 < uVar13) {
        uVar13 = uVar7;
      }
    }
    printf(" %.2f cycles per operation",
           (double)((float)uVar13 / (float)(ulong)((long)iVar20 + (long)iVar19)));
    if (bVar23) {
      printf(" [ERROR]");
    }
    putchar(10);
    bVar23 = false;
    fflush((FILE *)0x0);
    uVar21 = intersection_test(prVar6,run,BO);
    printf("intersection cardinality = %d \n",(ulong)uVar21);
    printf("%s: ","intersection_test(B1, B2, BO)");
    fflush((FILE *)0x0);
    iVar19 = 500;
    uVar13 = 0xffffffffffffffff;
    while (bVar22 = iVar19 != 0, iVar19 = iVar19 + -1, bVar22) {
      clock_gettime(3,(timespec *)&ts);
      lVar16 = CONCAT44(ts.tv_sec._4_4_,(int)ts.tv_sec);
      lVar15 = CONCAT44(ts.tv_nsec._4_4_,(int)ts.tv_nsec);
      uVar4 = intersection_test(prVar6,run,BO);
      if (uVar4 != uVar21) {
        bVar23 = true;
      }
      clock_gettime(3,(timespec *)&ts);
      uVar7 = (CONCAT44(ts.tv_sec._4_4_,(int)ts.tv_sec) - lVar16) * 1000000000 +
              (CONCAT44(ts.tv_nsec._4_4_,(int)ts.tv_nsec) - lVar15);
      if (uVar7 < uVar13) {
        uVar13 = uVar7;
      }
    }
    if ((long)(int)uVar21 < 0) {
      fVar24 = (float)((ulong)(uVar21 & 1) | (ulong)(long)(int)uVar21 >> 1);
      fVar24 = fVar24 + fVar24;
    }
    else {
      fVar24 = (float)(int)uVar21;
    }
    printf(" %.2f cycles per operation",(double)((float)uVar13 / fVar24));
    if (bVar23) {
      printf(" [ERROR]");
    }
    putchar(10);
    fflush((FILE *)0x0);
    run_container_free(prVar6);
    run_container_free(run);
    run_container_free(BO);
    return 0;
  }
LAB_001011f3:
  switch(uVar4) {
  case 0x1066:
switchD_001013ae_caseD_1066:
    pcVar17 = "Merom";
    goto LAB_001014ce;
  case 0x1067:
  case 0x106d:
    pcVar17 = "Penryn";
    goto LAB_001014ce;
  case 0x1068:
  case 0x1069:
  case 0x106b:
  case 0x106c:
switchD_001013ae_caseD_1068:
    pcVar17 = "unknown";
    goto LAB_001014ce;
  case 0x106a:
  case 0x106e:
    goto switchD_001013ae_caseD_106a;
  default:
    if (uVar4 - 99 < 2) {
      pcVar17 = "Prescott";
      goto LAB_001014ce;
    }
    if (uVar4 - 0x806c < 2) {
      pcVar17 = "TigerLake";
      goto LAB_001014ce;
    }
    if (uVar4 - 0xa065 < 2) {
      pcVar17 = "Cometlake";
      goto LAB_001014ce;
    }
    if (uVar4 == 0x66) {
      pcVar17 = "Presler";
      goto LAB_001014ce;
    }
    if (uVar4 == 0x6d) {
      pcVar17 = "Dothan";
      goto LAB_001014ce;
    }
    if (uVar4 == 0x6f) goto switchD_001013ae_caseD_1066;
    if (uVar4 == 0x16c) {
      pcVar17 = "Pineview";
      goto LAB_001014ce;
    }
    if (uVar4 == 0x266) {
      pcVar17 = "Lincroft";
      goto LAB_001014ce;
    }
    if (uVar4 == 0x366) {
      pcVar17 = "Cedarview";
      goto LAB_001014ce;
    }
    if (uVar4 == 0x306a) {
      pcVar17 = "IvyBridge";
      goto LAB_001014ce;
    }
    if (uVar4 == 0x306c) {
      pcVar17 = "Haswell";
      goto LAB_001014ce;
    }
    if (uVar4 == 0x306d) {
      pcVar17 = "Broadwell";
      goto LAB_001014ce;
    }
    if (uVar4 == 0x30f1) goto LAB_001013bc;
    if (uVar4 == 0x60f10) {
      pcVar17 = "Zen4";
      goto LAB_001014ce;
    }
    if (uVar4 == 0x506c) {
LAB_0010141c:
      pcVar17 = "Goldmont";
      goto LAB_001014ce;
    }
    if (uVar4 == 0x506e) {
      pcVar17 = "Skylake";
      goto LAB_001014ce;
    }
    if (uVar4 == 0x606a) {
LAB_00101428:
      pcVar17 = "Icelake";
    }
    else {
      if ((uVar4 != 0x60f0) && (uVar4 != 0x60f8)) {
        if (uVar4 == 0x706a) goto LAB_0010141c;
        if (uVar4 == 0x706e) goto LAB_00101428;
        if (uVar4 != 0x70f1) {
          if (uVar4 != 0x806e) {
            if ((uVar4 == 0x9067) || (uVar4 == 0x906a)) {
              pcVar17 = "Alderlake";
              goto LAB_001014ce;
            }
            if (uVar4 != 0x906e) {
              if (uVar4 != 0x90f0) {
                if (uVar4 == 0xa067) {
                  pcVar17 = "Rocketlake";
                  goto LAB_001014ce;
                }
                if (uVar4 == 0xb067) {
                  pcVar17 = "Raptorlake";
                  goto LAB_001014ce;
                }
                if (uVar4 != 0x20f10) {
                  if (uVar4 == 0x40f40) {
                    pcVar17 = "Zen3+";
                    goto LAB_001014ce;
                  }
                  if (uVar4 != 0x50f00) {
                    if (uVar4 == 0x406c) {
                      pcVar17 = "CherryTrail";
                      goto LAB_001014ce;
                    }
                    goto switchD_001013ae_caseD_1068;
                  }
                }
                pcVar17 = "Zen3";
                goto LAB_001014ce;
              }
              goto LAB_001013bc;
            }
          }
          pcVar17 = "Kabylake";
          goto LAB_001014ce;
        }
      }
LAB_001013bc:
      pcVar17 = "Zen2";
    }
    goto LAB_001014ce;
  }
}

Assistant:

int main() {
    int repeat = 500;
    int size = TESTSIZE;
    tellmeall();
    printf("run container benchmarks\n");
    run_container_t* B = run_container_create();
    BEST_TIME(add_test(B), 0, repeat, size);
    int answer = contains_test(B);
    size = 1 << 16;
    BEST_TIME(contains_test(B), answer, repeat, size);
    size = (1 << 16) / 3;
    BEST_TIME(remove_test(B), 0, repeat, size);
    run_container_free(B);

    for (int howmany = 32; howmany <= (1 << 16); howmany *= 8) {
        run_container_t* Bt = run_container_create();
        for (int j = 0; j < howmany; ++j) {
            run_container_add(Bt, (uint16_t)pcg32_random());
        }
        size_t nbrtestvalues = 1024;
        uint16_t* testvalues = malloc(nbrtestvalues * sizeof(uint16_t));
        printf("\n number of values in container = %d\n",
               run_container_cardinality(Bt));
        int card = run_container_cardinality(Bt);
        uint32_t* out = malloc(sizeof(uint32_t) * (unsigned long)card);
        BEST_TIME(run_container_to_uint32_array(out, Bt, 1234), card, repeat,
                  card);
        free(out);
        BEST_TIME_PRE_ARRAY(Bt, run_container_contains, run_cache_prefetch,
                            testvalues, nbrtestvalues);
        BEST_TIME_PRE_ARRAY(Bt, run_container_contains, run_cache_flush,
                            testvalues, nbrtestvalues);
        free(testvalues);
        run_container_free(Bt);
    }
    printf("\n");

    run_container_t* B1 = run_container_create();
    for (int x = 0; x < 1 << 16; x += 3) {
        run_container_add(B1, (uint16_t)x);
    }
    run_container_t* B2 = run_container_create();
    for (int x = 0; x < 1 << 16; x += 5) {
        run_container_add(B2, (uint16_t)x);
    }
    int32_t inputsize;
    inputsize = B1->n_runs + B2->n_runs;
    run_container_t* BO = run_container_create();
    printf("\nUnion and intersections...\n");
    printf("\nNote:\n");
    printf(
        "union times are expressed in cycles per number of input elements "
        "(both runs)\n");
    printf(
        "intersection times are expressed in cycles per number of output "
        "elements\n\n");
    printf("==intersection and union test 1 \n");
    printf("input 1 cardinality = %d, input 2 cardinality = %d \n",
           run_container_cardinality(B1), run_container_cardinality(B2));
    answer = union_test(B1, B2, BO);
    printf("union cardinality = %d \n", answer);
    printf("B1 card = %d B2 card = %d \n", run_container_cardinality(B1),
           run_container_cardinality(B2));
    inputsize = B1->n_runs + B2->n_runs;
    BEST_TIME(union_test(B1, B2, BO), answer, repeat, inputsize);
    answer = intersection_test(B1, B2, BO);
    printf("intersection cardinality = %d \n", answer);
    BEST_TIME(intersection_test(B1, B2, BO), answer, repeat, answer);
    printf("==intersection and union test 2 \n");
    B1->n_runs = 0;
    B2->n_runs = 0;
    for (int x = 0; x < (1 << 16); x += 64) {
        int length = x % 11;
        for (int y = 0; y < length; ++y)
            run_container_add(B1, (uint16_t)(x + y));
    }
    for (int x = 1; x < 1 << 16; x += x) {
        run_container_add(B2, (uint16_t)x);
    }
    printf("input 1 cardinality = %d, input 2 cardinality = %d \n",
           run_container_cardinality(B1), run_container_cardinality(B2));
    answer = union_test(B1, B2, BO);
    printf("union cardinality = %d \n", answer);
    printf("B1 card = %d B2 card = %d \n", run_container_cardinality(B1),
           run_container_cardinality(B2));
    inputsize = B1->n_runs + B2->n_runs;

    BEST_TIME(union_test(B1, B2, BO), answer, repeat, inputsize);
    answer = intersection_test(B1, B2, BO);
    printf("intersection cardinality = %d \n", answer);
    BEST_TIME(intersection_test(B1, B2, BO), answer, repeat, answer);

    run_container_free(B1);
    run_container_free(B2);
    run_container_free(BO);
    return 0;
}